

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

void crnd::crnd_assert(char *pExp,char *pFile,uint line)

{
  bool bVar1;
  uint in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  char buf [512];
  char acStack_218 [536];
  
  snprintf(acStack_218,0x200,"%s(%u): Assertion failure: \"%s\"\n",in_RSI,(ulong)in_EDX,in_RDI);
  crnd_output_debug_string(acStack_218);
  puts(acStack_218);
  bVar1 = crnd_is_debugger_present();
  if (bVar1) {
    crnd_debug_break();
  }
  return;
}

Assistant:

void crnd_assert(const char* pExp, const char* pFile, unsigned line) {
  char buf[512];

#if defined(_WIN32)
  sprintf_s(buf, sizeof(buf), "%s(%u): Assertion failure: \"%s\"\n", pFile, line, pExp);
#else
  snprintf(buf, sizeof(buf), "%s(%u): Assertion failure: \"%s\"\n", pFile, line, pExp);
#endif

  crnd_output_debug_string(buf);

  puts(buf);

  if (crnd_is_debugger_present())
    crnd_debug_break();
}